

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sparc.c
# Opt level: O0

void test(void)

{
  cs_err cVar1;
  size_t count_00;
  ulong local_78;
  size_t j;
  cs_err err;
  size_t count;
  cs_insn *pcStack_58;
  int i;
  cs_insn *insn;
  uint64_t address;
  platform platforms [2];
  
  memcpy(&address,&DAT_002d2d40,0x40);
  insn = (cs_insn *)0x1000;
  for (count._4_4_ = 0; count._4_4_ < 2; count._4_4_ = count._4_4_ + 1) {
    cVar1 = cs_open(*(cs_arch *)&platforms[(long)(int)count._4_4_ + -1].comment,
                    *(cs_mode *)((long)&platforms[(long)(int)count._4_4_ + -1].comment + 4),&handle)
    ;
    if (cVar1 == CS_ERR_OK) {
      cs_option(handle,CS_OPT_DETAIL,3);
      count_00 = cs_disasm(handle,*(uint8_t **)(platforms + (int)count._4_4_),
                           (size_t)platforms[(int)count._4_4_].code,(uint64_t)insn,0,
                           &stack0xffffffffffffffa8);
      if (count_00 == 0) {
        printf("****************\n");
        printf("Platform: %s\n",platforms[(int)count._4_4_].size);
        print_string_hex("Code:",*(uchar **)(platforms + (int)count._4_4_),
                         (size_t)platforms[(int)count._4_4_].code);
        printf("ERROR: Failed to disasm given code!\n");
      }
      else {
        printf("****************\n");
        printf("Platform: %s\n",platforms[(int)count._4_4_].size);
        print_string_hex("Code:",*(uchar **)(platforms + (int)count._4_4_),
                         (size_t)platforms[(int)count._4_4_].code);
        printf("Disasm:\n");
        for (local_78 = 0; local_78 < count_00; local_78 = local_78 + 1) {
          printf("0x%lx:\t%s\t%s\n",pcStack_58[local_78].address,pcStack_58[local_78].mnemonic,
                 pcStack_58[local_78].op_str);
          print_insn_detail(pcStack_58 + local_78);
        }
        printf("0x%lx:\n",pcStack_58[local_78 - 1].address + (ulong)pcStack_58[local_78 - 1].size);
        cs_free(pcStack_58,count_00);
      }
      printf("\n");
      cs_close(&handle);
    }
    else {
      printf("Failed on cs_open() with error returned: %u\n",(ulong)cVar1);
    }
  }
  return;
}

Assistant:

static void test()
{
#define SPARC_CODE "\x80\xa0\x40\x02\x85\xc2\x60\x08\x85\xe8\x20\x01\x81\xe8\x00\x00\x90\x10\x20\x01\xd5\xf6\x10\x16\x21\x00\x00\x0a\x86\x00\x40\x02\x01\x00\x00\x00\x12\xbf\xff\xff\x10\xbf\xff\xff\xa0\x02\x00\x09\x0d\xbf\xff\xff\xd4\x20\x60\x00\xd4\x4e\x00\x16\x2a\xc2\x80\x03"

#define SPARCV9_CODE "\x81\xa8\x0a\x24\x89\xa0\x10\x20\x89\xa0\x1a\x60\x89\xa0\x00\xe0"

	struct platform platforms[] = {
		{
			CS_ARCH_SPARC,
			CS_MODE_BIG_ENDIAN,
			(unsigned char*)SPARC_CODE,
			sizeof(SPARC_CODE) - 1,
			"Sparc",
		},
		{
			CS_ARCH_SPARC,
			(cs_mode)(CS_MODE_BIG_ENDIAN + CS_MODE_V9),
			(unsigned char*)SPARCV9_CODE,
			sizeof(SPARCV9_CODE) - 1,
			"SparcV9"
		},
	};

	uint64_t address = 0x1000;
	cs_insn *insn;
	int i;
	size_t count;

	for (i = 0; i < sizeof(platforms)/sizeof(platforms[0]); i++) {
		cs_err err = cs_open(platforms[i].arch, platforms[i].mode, &handle);
		if (err) {
			printf("Failed on cs_open() with error returned: %u\n", err);
			continue;
		}

		cs_option(handle, CS_OPT_DETAIL, CS_OPT_ON);

		count = cs_disasm(handle, platforms[i].code, platforms[i].size, address, 0, &insn);
		if (count) {
			size_t j;

			printf("****************\n");
			printf("Platform: %s\n", platforms[i].comment);
			print_string_hex("Code:", platforms[i].code, platforms[i].size);
			printf("Disasm:\n");

			for (j = 0; j < count; j++) {
				printf("0x%"PRIx64":\t%s\t%s\n", insn[j].address, insn[j].mnemonic, insn[j].op_str);
				print_insn_detail(&insn[j]);
			}
			printf("0x%"PRIx64":\n", insn[j-1].address + insn[j-1].size);

			// free memory allocated by cs_disasm()
			cs_free(insn, count);
		} else {
			printf("****************\n");
			printf("Platform: %s\n", platforms[i].comment);
			print_string_hex("Code:", platforms[i].code, platforms[i].size);
			printf("ERROR: Failed to disasm given code!\n");
		}

		printf("\n");

		cs_close(&handle);
	}
}